

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall Preprocessor::Preprocessor(Preprocessor *this,string *prog_path,string *data_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  string local_100 [8];
  string data_filename_without_extension;
  size_type q;
  string data_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78 [8];
  string prog_filename_without_extension;
  size_type p;
  string prog_filename;
  string *data_path_local;
  string *prog_path_local;
  Preprocessor *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->p_A_path);
  std::__cxx11::string::string((string *)&this->p_B_path);
  std::__cxx11::string::string((string *)&this->d_path);
  std::__cxx11::string::string((string *)&this->d_A_path);
  std::__cxx11::string::string((string *)&this->d_B_path);
  std::__cxx11::string::operator=((string *)&this->p_A_path,"../inputs/alice/");
  std::__cxx11::string::operator=((string *)&this->p_B_path,"../inputs/bob/");
  std::__cxx11::string::operator=((string *)this,(string *)prog_path);
  std::__cxx11::string::find_last_of((char *)prog_path,0x104024);
  std::__cxx11::string::substr((ulong)&p,(ulong)prog_path);
  std::__cxx11::string::find_last_of((char)&p,0x2e);
  std::__cxx11::string::substr((ulong)local_78,(ulong)&p);
  std::operator+(local_98,(char *)local_78);
  std::__cxx11::string::append((string *)&this->p_A_path);
  std::__cxx11::string::~string((string *)local_98);
  std::operator+(local_b8,(char *)local_78);
  std::__cxx11::string::append((string *)&this->p_B_path);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::operator=((string *)&this->d_A_path,"../inputs/alice/");
  std::__cxx11::string::operator=((string *)&this->d_B_path,"../inputs/bob/");
  std::__cxx11::string::operator=((string *)&this->d_path,(string *)data_path);
  std::__cxx11::string::find_last_of((char *)data_path,0x104024);
  std::__cxx11::string::substr((ulong)&q,(ulong)data_path);
  std::__cxx11::string::find_last_of((char)&q,0x2e);
  std::__cxx11::string::substr((ulong)local_100,(ulong)&q);
  std::operator+(local_120,(char *)local_100);
  std::__cxx11::string::append((string *)&this->d_A_path);
  std::__cxx11::string::~string((string *)local_120);
  std::operator+(local_140,(char *)local_100);
  std::__cxx11::string::append((string *)&this->d_B_path);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)&q);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&p);
  return;
}

Assistant:

Preprocessor::Preprocessor(std::string prog_path, std::string data_path)
{
  p_A_path = "../inputs/alice/";
  p_B_path = "../inputs/bob/";
  p_path = prog_path;
  std::string prog_filename = prog_path.substr(prog_path.find_last_of("/\\") + 1);
  std::string::size_type const p(prog_filename.find_last_of('.'));
  std::string prog_filename_without_extension = prog_filename.substr(0, p);
  p_A_path.append(prog_filename_without_extension + "_A.txt");
  p_B_path.append(prog_filename_without_extension + "_B.txt");

  d_A_path = "../inputs/alice/";
  d_B_path = "../inputs/bob/";
  d_path = data_path;
  std::string data_filename = data_path.substr(data_path.find_last_of("/\\") + 1);
  std::string::size_type const q(data_filename.find_last_of('.'));
  std::string data_filename_without_extension = data_filename.substr(0, q);
  d_A_path.append(data_filename_without_extension + "_A.txt");
  d_B_path.append(data_filename_without_extension + "_B.txt");
  
}